

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::MessageOptions::InternalSerializeWithCachedSizesToArray
          (MessageOptions *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  int iVar2;
  Type *value;
  uint8 *puVar3;
  UnknownFieldSet *unknown_fields;
  int index;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = internal::WireFormatLite::WriteBoolToArray(1,this->message_set_wire_format_,target);
  }
  if ((uVar1 & 2) != 0) {
    target = internal::WireFormatLite::WriteBoolToArray
                       (2,this->no_standard_descriptor_accessor_,target);
  }
  if ((uVar1 & 4) != 0) {
    target = internal::WireFormatLite::WriteBoolToArray(3,this->deprecated_,target);
  }
  if ((uVar1 & 8) != 0) {
    target = internal::WireFormatLite::WriteBoolToArray(7,this->map_entry_,target);
  }
  iVar2 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar2 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    target = internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<google::protobuf::UninterpretedOption>
                       (999,value,deterministic,target);
  }
  puVar3 = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,deterministic,target);
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar3;
  }
  unknown_fields = MessageOptions::unknown_fields(this);
  puVar3 = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,puVar3);
  return puVar3;
}

Assistant:

::google::protobuf::uint8* MessageOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.MessageOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional bool message_set_wire_format = 1 [default = false];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(1, this->message_set_wire_format(), target);
  }

  // optional bool no_standard_descriptor_accessor = 2 [default = false];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->no_standard_descriptor_accessor(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->deprecated(), target);
  }

  // optional bool map_entry = 7;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->map_entry(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.MessageOptions)
  return target;
}